

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O1

void __thiscall GB::reti(GB *this)

{
  u16 uVar1;
  u8 uVar2;
  ulong uVar3;
  
  uVar3 = (this->s).op_tick - 6;
  switch(uVar3 << 0x3d | uVar3 >> 3) {
  case 0:
    (this->s).ime = true;
    (this->s).ime_enable = false;
    break;
  case 1:
    uVar1 = (this->s).sp;
    (this->s).sp = uVar1 + 1;
    uVar2 = Read(this,uVar1);
    (this->s).field_6.field_0.z = uVar2;
    break;
  case 2:
    uVar1 = (this->s).sp;
    (this->s).sp = uVar1 + 1;
    uVar2 = Read(this,uVar1);
    (this->s).field_6.field_0.w = uVar2;
    break;
  case 3:
    (this->s).pc = (u16)(this->s).field_6;
    (this->s).op_tick = -2;
  }
  return;
}

Assistant:

void GB::reti() {
  switch (s.op_tick) {
    case 6: s.ime_enable = false; s.ime = true; break;
    case 14: s.z = pop(); break;
    case 22: s.w = pop(); break;
    case 30: s.pc = s.wz; op_done(); break;
  }
}